

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O0

char * ufmt_getDecNumChars_63(UFormattable *fmt,int32_t *len,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  Formattable *this;
  CharString *this_00;
  CharString *charString;
  Formattable *obj;
  UErrorCode *status_local;
  int32_t *len_local;
  UFormattable *fmt_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    this = icu_63::Formattable::fromUFormattable(fmt);
    this_00 = icu_63::Formattable::internalGetCharString(this,status);
    UVar1 = U_FAILURE(*status);
    if (UVar1 == '\0') {
      if (this_00 == (CharString *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        fmt_local = (UFormattable *)0x436aee;
      }
      else {
        if (len != (int32_t *)0x0) {
          iVar2 = icu_63::CharString::length(this_00);
          *len = iVar2;
        }
        fmt_local = (UFormattable *)icu_63::CharString::data(this_00);
      }
    }
    else {
      fmt_local = (UFormattable *)0x436aee;
    }
  }
  else {
    fmt_local = (UFormattable *)0x436aee;
  }
  return (char *)fmt_local;
}

Assistant:

U_DRAFT const char * U_EXPORT2
ufmt_getDecNumChars(UFormattable *fmt, int32_t *len, UErrorCode *status) {
  if(U_FAILURE(*status)) {
    return "";
  }
  Formattable *obj = Formattable::fromUFormattable(fmt);
  CharString *charString = obj->internalGetCharString(*status);
  if(U_FAILURE(*status)) {
    return "";
  }
  if(charString == NULL) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    return "";
  } else {
    if(len!=NULL) {
      *len = charString->length();
    }
    return charString->data();
  }
}